

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
::_positive_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Dimension DVar4;
  pointer puVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  Pos_index PVar9;
  Pos_index PVar10;
  ulong uVar11;
  ID_index pivot2;
  ID_index IVar12;
  long lVar13;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar14;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar15;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar16;
  anon_class_1_0_00000001 local_58;
  anon_class_1_0_00000001 local_57;
  anon_class_1_0_00000001 local_56;
  anon_class_1_0_00000001 local_55;
  Index local_54;
  anon_class_8_1_e4bd5e45 local_50;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *local_48;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *local_40;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *local_38;
  
  uVar11 = (ulong)columnIndex1;
  puVar5 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)this[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = uVar11 * 0x30;
  pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
             *)(lVar6 + lVar13);
  uVar7 = (ulong)columnIndex2;
  pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
             *)(lVar6 + uVar7 * 0x30);
  uVar1 = *(uint *)(lVar6 + 4 + lVar13);
  uVar2 = *(uint *)(lVar6 + 4 + uVar7 * 0x30);
  uVar3 = puVar5[uVar1];
  puVar5[uVar1] = puVar5[uVar2];
  puVar5[uVar2] = uVar3;
  local_54 = columnIndex2;
  if (*(int *)(lVar6 + 8 + lVar13) == -1) {
    PVar9 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::birth(&this->super_type,(pIVar16->super_Chain_column_option).pivot_);
    local_48 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                *)CONCAT44(local_48._4_4_,PVar9);
    local_40 = pIVar14;
    PVar9 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::birth(&this->super_type,(pIVar14->super_Chain_column_option).pivot_);
    puVar5 = (pointer)this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if ((PVar9 <= (uint)local_48) ||
       ((pIVar16->super_Chain_column_option).pairedColumn_ != 0xffffffff)) {
      uVar1 = puVar5[uVar11 * 0xc + 1];
      goto LAB_00166d4c;
    }
    pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar5 + uVar7 * 0xc);
    uVar1 = puVar5[uVar7 * 0xc + 1];
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar5 + uVar11 * 0xc);
    local_54 = columnIndex1;
    local_50.targetColumn = pIVar14;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar15,pIVar14,&local_56,&local_50,&local_57,&local_58,&local_55);
    if (bVar8) {
      IVar12 = (pIVar14->super_Chain_column_option).pivot_;
      (pIVar14->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar12;
      DVar4 = (pIVar14->super_Column_dimension_option).dim_;
      (pIVar14->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_;
      (pIVar15->super_Column_dimension_option).dim_ = DVar4;
    }
    uVar2 = (pIVar14->super_Chain_column_option).pivot_;
    if (uVar1 != uVar2) {
      puVar5 = this[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar5[uVar1];
      puVar5[uVar1] = puVar5[uVar2];
      puVar5[uVar2] = uVar3;
    }
    IVar12 = (local_40->super_Chain_column_option).pivot_;
    pivot2 = (pIVar16->super_Chain_column_option).pivot_;
  }
  else {
    uVar1 = (pIVar16->super_Chain_column_option).pivot_;
    if ((pIVar16->super_Chain_column_option).pairedColumn_ == 0xffffffff) {
      local_50.targetColumn = pIVar16;
      bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar14,pIVar16,&local_56,&local_50,&local_57,&local_58,&local_55);
      if (bVar8) {
        IVar12 = (pIVar16->super_Chain_column_option).pivot_;
        (pIVar16->super_Chain_column_option).pivot_ = (pIVar14->super_Chain_column_option).pivot_;
        (pIVar14->super_Chain_column_option).pivot_ = IVar12;
        DVar4 = (pIVar16->super_Column_dimension_option).dim_;
        (pIVar16->super_Column_dimension_option).dim_ =
             (pIVar14->super_Column_dimension_option).dim_;
        (pIVar14->super_Column_dimension_option).dim_ = DVar4;
      }
      uVar2 = (pIVar16->super_Chain_column_option).pivot_;
      if (uVar1 != uVar2) {
        puVar5 = this[1].super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = puVar5[uVar1];
        puVar5[uVar1] = puVar5[uVar2];
        puVar5[uVar2] = uVar3;
      }
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_transpose
                (&this->super_type,(pIVar14->super_Chain_column_option).pivot_,
                 (pIVar16->super_Chain_column_option).pivot_);
      return columnIndex1;
    }
    local_48 = pIVar16;
    PVar9 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            ::death(&this->super_type,uVar1);
    PVar10 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
             ::death(&this->super_type,(pIVar14->super_Chain_column_option).pivot_);
    lVar6 = (long)this[1].super_type.
                  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                  .barcode_.
                  super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_38 = this;
    if (PVar10 <= PVar9) {
      lVar13 = (ulong)(pIVar14->super_Chain_column_option).pairedColumn_ * 0x30;
      pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)(lVar6 + lVar13);
      uVar1 = *(uint *)(lVar6 + 4 + lVar13);
      pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)((ulong)(local_48->super_Chain_column_option).pairedColumn_ * 0x30 + lVar6);
      local_50.targetColumn = pIVar14;
      bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar16,pIVar14,&local_56,&local_50,&local_57,&local_58,&local_55);
      if (bVar8) {
        IVar12 = (pIVar14->super_Chain_column_option).pivot_;
        (pIVar14->super_Chain_column_option).pivot_ = (pIVar16->super_Chain_column_option).pivot_;
        (pIVar16->super_Chain_column_option).pivot_ = IVar12;
        DVar4 = (pIVar14->super_Column_dimension_option).dim_;
        (pIVar14->super_Column_dimension_option).dim_ =
             (pIVar16->super_Column_dimension_option).dim_;
        (pIVar16->super_Column_dimension_option).dim_ = DVar4;
      }
      uVar2 = (pIVar14->super_Chain_column_option).pivot_;
      if (uVar1 != uVar2) {
        puVar5 = local_38[1].super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = puVar5[uVar1];
        puVar5[uVar1] = puVar5[uVar2];
        puVar5[uVar2] = uVar3;
      }
      puVar5 = (pointer)local_38[1].super_type.
                        super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                        .barcode_.
                        super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = puVar5[uVar11 * 0xc + 1];
      this = local_38;
LAB_00166d4c:
      pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)(puVar5 + uVar11 * 0xc);
      pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                 *)(puVar5 + uVar7 * 0xc);
      local_50.targetColumn = pIVar16;
      bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar14,pIVar16,&local_56,&local_50,&local_57,&local_58,&local_55);
      if (bVar8) {
        IVar12 = (pIVar16->super_Chain_column_option).pivot_;
        (pIVar16->super_Chain_column_option).pivot_ = (pIVar14->super_Chain_column_option).pivot_;
        (pIVar14->super_Chain_column_option).pivot_ = IVar12;
        DVar4 = (pIVar16->super_Column_dimension_option).dim_;
        (pIVar16->super_Column_dimension_option).dim_ =
             (pIVar14->super_Column_dimension_option).dim_;
        (pIVar14->super_Column_dimension_option).dim_ = DVar4;
      }
      uVar2 = (pIVar16->super_Chain_column_option).pivot_;
      if (uVar1 == uVar2) {
        return local_54;
      }
      puVar5 = this[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar5[uVar1];
      puVar5[uVar1] = puVar5[uVar2];
      puVar5[uVar2] = uVar3;
      return local_54;
    }
    lVar13 = (ulong)(local_48->super_Chain_column_option).pairedColumn_ * 0x30;
    pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(lVar6 + lVar13);
    uVar1 = *(uint *)(lVar6 + 4 + lVar13);
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)((ulong)(pIVar14->super_Chain_column_option).pairedColumn_ * 0x30 + lVar6);
    local_54 = columnIndex1;
    local_50.targetColumn = pIVar16;
    local_40 = pIVar14;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar15,pIVar16,&local_56,&local_50,&local_57,&local_58,&local_55);
    this = local_38;
    if (bVar8) {
      IVar12 = (pIVar16->super_Chain_column_option).pivot_;
      (pIVar16->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar12;
      DVar4 = (pIVar16->super_Column_dimension_option).dim_;
      (pIVar16->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_;
      (pIVar15->super_Column_dimension_option).dim_ = DVar4;
    }
    uVar2 = (pIVar16->super_Chain_column_option).pivot_;
    if (uVar1 != uVar2) {
      puVar5 = local_38[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar5[uVar1];
      puVar5[uVar1] = puVar5[uVar2];
      puVar5[uVar2] = uVar3;
    }
    puVar5 = (pointer)local_38[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    pIVar14 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar5 + uVar7 * 0xc);
    uVar1 = puVar5[uVar7 * 0xc + 1];
    pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               *)(puVar5 + uVar11 * 0xc);
    local_50.targetColumn = pIVar14;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                      (pIVar16,pIVar14,&local_56,&local_50,&local_57,&local_58,&local_55);
    if (bVar8) {
      IVar12 = (pIVar14->super_Chain_column_option).pivot_;
      (pIVar14->super_Chain_column_option).pivot_ = (pIVar16->super_Chain_column_option).pivot_;
      (pIVar16->super_Chain_column_option).pivot_ = IVar12;
      DVar4 = (pIVar14->super_Column_dimension_option).dim_;
      (pIVar14->super_Column_dimension_option).dim_ = (pIVar16->super_Column_dimension_option).dim_;
      (pIVar16->super_Column_dimension_option).dim_ = DVar4;
    }
    uVar2 = (pIVar14->super_Chain_column_option).pivot_;
    if (uVar1 != uVar2) {
      puVar5 = this[1].super_type.
               super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
               .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar5[uVar1];
      puVar5[uVar1] = puVar5[uVar2];
      puVar5[uVar2] = uVar3;
    }
    IVar12 = (local_40->super_Chain_column_option).pivot_;
    pivot2 = (local_48->super_Chain_column_option).pivot_;
  }
  Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  ::positive_transpose(&this->super_type,IVar12,pivot2);
  return local_54;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }
  // TODO: factorize the cases
  // But for debug it is much more easier to understand what is happening when split like this
  if (!col1.is_paired()) {  // F x *
    bool hasSmallerBirth;
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      // this order because position were swapped with CP::swap_positions
      hasSmallerBirth = (CP::birth(col2.get_pivot()) < CP::birth(col1.get_pivot()));
    } else {
      hasSmallerBirth = birthComp_(columnIndex1, columnIndex2);
    }

    if (!col2.is_paired() && hasSmallerBirth) {
      _matrix()->add_to(columnIndex1, columnIndex2);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
      }
      return columnIndex1;
    }
    _matrix()->add_to(columnIndex2, columnIndex1);

    return columnIndex2;
  }

  if (!col2.is_paired()) {  // G x F
    static_cast<Master_chain_matrix*>(this)->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  bool hasSmallerDeath;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    // this order because position were swapped with CP::swap_positions
    hasSmallerDeath = (CP::death(col2.get_pivot()) < CP::death(col1.get_pivot()));
  } else {
    hasSmallerDeath = deathComp_(columnIndex1, columnIndex2);
  }

  // G x G
  if (hasSmallerDeath)
  {
    _matrix()->add_to(col1.get_paired_chain_index(), col2.get_paired_chain_index());
    _matrix()->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  _matrix()->add_to(col2.get_paired_chain_index(), col1.get_paired_chain_index());
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}